

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int cuddNodeArrayRecur(DdNode *f,DdNodePtr *table,int index)

{
  int iVar1;
  int eindex;
  int tindex;
  int index_local;
  DdNodePtr *table_local;
  DdNode *f_local;
  
  f_local._4_4_ = index;
  if (((ulong)f->next & 1) != 0) {
    f->next = (DdNode *)((ulong)f->next & 0xfffffffffffffffe);
    if (f->index == 0x7fffffff) {
      table[index] = f;
      f_local._4_4_ = index + 1;
    }
    else {
      iVar1 = cuddNodeArrayRecur((f->type).kids.T,table,index);
      iVar1 = cuddNodeArrayRecur((DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe),table,
                                 iVar1);
      table[iVar1] = f;
      f_local._4_4_ = iVar1 + 1;
    }
  }
  return f_local._4_4_;
}

Assistant:

static int
cuddNodeArrayRecur(
  DdNode *f,
  DdNodePtr *table,
  int index)
{
    int tindex, eindex;

    if (!Cudd_IsComplement(f->next)) {
        return(index);
    }
    /* Clear visited flag. */
    f->next = Cudd_Regular(f->next);
    if (cuddIsConstant(f)) {
        table[index] = f;
        return(index + 1);
    }
    tindex = cuddNodeArrayRecur(cuddT(f), table, index);
    eindex = cuddNodeArrayRecur(Cudd_Regular(cuddE(f)), table, tindex);
    table[eindex] = f;
    return(eindex + 1);

}